

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

void duckdb::Prefix::ConcatGate(ART *art,Node *parent,uint8_t byte,Node *child)

{
  ulong uVar1;
  byte bVar2;
  idx_t iVar3;
  uint8_t byte_local;
  IndexPointer local_50;
  Prefix prefix;
  
  local_50.data = 0;
  uVar1 = (child->super_IndexPointer).data;
  bVar2 = (byte)(uVar1 >> 0x38);
  byte_local = byte;
  if ((bVar2 & 0x7f) == 1) {
    NewInternal(&prefix,art,(Node *)&local_50,&byte_local,'\x01',0,PREFIX);
    ((prefix.ptr)->super_IndexPointer).data = 0;
    Append(&prefix,art,(Node)(child->super_IndexPointer).data);
  }
  else {
    if ((bVar2 & 0x7f) == 7) {
      iVar3 = uVar1 & 0xffffffffffffff | 0x700000000000000;
      goto LAB_01937dd2;
    }
    NewInternal(&prefix,art,(Node *)&local_50,&byte_local,'\x01',0,PREFIX);
    ((prefix.ptr)->super_IndexPointer).data = (child->super_IndexPointer).data;
  }
  iVar3 = local_50.data | 0x8000000000000000;
LAB_01937dd2:
  if (((parent->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) {
    GetTail(&prefix,art,parent);
    ((prefix.ptr)->super_IndexPointer).data = iVar3;
  }
  else {
    (parent->super_IndexPointer).data = iVar3;
  }
  return;
}

Assistant:

void Prefix::ConcatGate(ART &art, Node &parent, uint8_t byte, const Node &child) {
	D_ASSERT(child.HasMetadata());
	Node new_prefix = Node();

	// Inside gates, inlined row IDs are not prefixed.
	if (child.GetType() == NType::LEAF_INLINED) {
		Leaf::New(new_prefix, child.GetRowId());

	} else if (child.GetType() == PREFIX) {
		// At least one more row ID in this gate.
		auto prefix = NewInternal(art, new_prefix, &byte, 1, 0, PREFIX);
		prefix.ptr->Clear();
		prefix.Append(art, child);
		new_prefix.SetGateStatus(GateStatus::GATE_SET);

	} else {
		// At least one more row ID in this gate.
		auto prefix = NewInternal(art, new_prefix, &byte, 1, 0, PREFIX);
		*prefix.ptr = child;
		new_prefix.SetGateStatus(GateStatus::GATE_SET);
	}

	if (parent.GetType() != PREFIX) {
		parent = new_prefix;
		return;
	}
	*GetTail(art, parent).ptr = new_prefix;
}